

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseUnresolvedQualifierLevel(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar6;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar5) {
    bVar6 = 0;
  }
  else {
    bVar5 = ParseSimpleId((State *)CONCAT17(in_stack_ffffffffffffffb7,
                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                     CONCAT15(in_stack_ffffffffffffffb5,
                                                              in_stack_ffffffffffffffb0))));
    if (bVar5) {
      bVar6 = 1;
    }
    else {
      iVar1 = (in_RDI->parse_state).mangled_idx;
      iVar2 = (in_RDI->parse_state).out_cur_idx;
      iVar3 = (in_RDI->parse_state).prev_name_idx;
      uVar4 = *(undefined4 *)&(in_RDI->parse_state).field_0xc;
      bVar5 = ParseSubstitution((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                  in_stack_fffffffffffffff8),
                                SUB81((ulong)in_RDI >> 0x38,0));
      if ((bVar5) && (bVar5 = ParseTemplateArgs(in_stack_ffffffffffffffe8.state_), bVar5)) {
        bVar6 = 1;
      }
      else {
        (in_RDI->parse_state).mangled_idx = iVar1;
        (in_RDI->parse_state).out_cur_idx = iVar2;
        (in_RDI->parse_state).prev_name_idx = iVar3;
        *(undefined4 *)&(in_RDI->parse_state).field_0xc = uVar4;
        bVar6 = 0;
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(bVar6 & 1);
}

Assistant:

static bool ParseUnresolvedQualifierLevel(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  if (ParseSimpleId(state)) return true;

  ParseState copy = state->parse_state;
  if (ParseSubstitution(state, /*accept_std=*/false) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}